

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O3

void __thiscall I2cAnalyzer::SetupResults(I2cAnalyzer *this)

{
  I2cAnalyzerResults *pIVar1;
  I2cAnalyzerResults *this_00;
  
  this_00 = (I2cAnalyzerResults *)operator_new(0x20);
  I2cAnalyzerResults::I2cAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  pIVar1 = (this->mResults)._M_ptr;
  if (pIVar1 != this_00) {
    if (pIVar1 != (I2cAnalyzerResults *)0x0) {
      (**(code **)(*(long *)pIVar1 + 8))();
    }
    (this->mResults)._M_ptr = this_00;
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void I2cAnalyzer::SetupResults()
{
    mResults.reset( new I2cAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mSdaChannel );
}